

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_docstring_comment
          (t_netstd_generator *this,ostream *out,string *contents)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *contents_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = contents;
  contents_local = (string *)out;
  out_local = (ostream *)this;
  std::operator+(&local_40,"/// <summary>",&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"/// ",&local_61);
  std::operator+(&local_98,"/// </summary>",&::endl_abi_cxx11_);
  docstring_comment(this,out,&local_40,&local_60,contents,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_docstring_comment(ostream& out, string contents)
{
    docstring_comment(out, "/// <summary>" + endl, "/// ", contents, "/// </summary>" + endl);
}